

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# robust_deserialization_unit.c
# Opt level: O2

void deserialize_run_container_incorrect_cardinality_still_allowed(void)

{
  uint8_t data [15];
  
  data[8] = '\0';
  data[9] = '\x01';
  data[10] = '\0';
  data[0xb] = '\0';
  data[0xc] = '\0';
  data[0xd] = '\b';
  data[0xe] = '\0';
  data[0] = ';';
  data[1] = '0';
  data[2] = '\0';
  data[3] = '\0';
  data[4] = '\x01';
  data[5] = '\0';
  data[6] = '\0';
  data[7] = '\0';
  valid_deserialize_test(data,0xf);
  return;
}

Assistant:

DEFINE_TEST(deserialize_run_container_incorrect_cardinality_still_allowed) {
    // clang-format off
    const uint8_t data[] = {
        0x3B, 0x30, // Serial Cookie
        0, 0,       // Container count - 1
        0x01,       // Run Flag Bitset (single container is a run)
        0, 0,       // Upper 16 bits of the first container
        0, 0,       // Cardinality - 1 of the first container
        1, 0,       // First Container - Number of runs
        0, 0,       // First run start
        8, 0,       // First run length - 1 (9 items, but cardinality is 1)
    };
    // clang-format on

    // The cardinality doesn't match the actual number of items in the run,
    // but the implementation ignores the cardinality field.
    valid_deserialize_test(data, sizeof(data));
}